

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O0

CRYPTO_BUFFER_POOL * CRYPTO_BUFFER_POOL_new(void)

{
  lhash_st_CRYPTO_BUFFER *plVar1;
  CRYPTO_BUFFER_POOL *pool;
  
  pool = (CRYPTO_BUFFER_POOL *)OPENSSL_zalloc(0x50);
  if (pool == (CRYPTO_BUFFER_POOL *)0x0) {
    pool = (CRYPTO_BUFFER_POOL *)0x0;
  }
  else {
    plVar1 = lh_CRYPTO_BUFFER_new(CRYPTO_BUFFER_hash,CRYPTO_BUFFER_cmp);
    pool->bufs = plVar1;
    if (pool->bufs == (lhash_st_CRYPTO_BUFFER *)0x0) {
      OPENSSL_free(pool);
      pool = (CRYPTO_BUFFER_POOL *)0x0;
    }
    else {
      CRYPTO_MUTEX_init(&pool->lock);
      RAND_bytes((uchar *)pool->hash_key,0x10);
    }
  }
  return pool;
}

Assistant:

CRYPTO_BUFFER_POOL *CRYPTO_BUFFER_POOL_new(void) {
  CRYPTO_BUFFER_POOL *pool = reinterpret_cast<CRYPTO_BUFFER_POOL *>(
      OPENSSL_zalloc(sizeof(CRYPTO_BUFFER_POOL)));
  if (pool == NULL) {
    return NULL;
  }

  pool->bufs = lh_CRYPTO_BUFFER_new(CRYPTO_BUFFER_hash, CRYPTO_BUFFER_cmp);
  if (pool->bufs == NULL) {
    OPENSSL_free(pool);
    return NULL;
  }

  CRYPTO_MUTEX_init(&pool->lock);
  RAND_bytes((uint8_t *)&pool->hash_key, sizeof(pool->hash_key));

  return pool;
}